

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void display_img(Mat *disp)

{
  int iVar1;
  char *__end;
  long *local_68 [2];
  long local_58 [2];
  _InputArray local_48;
  
  do {
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Current image","");
    local_48.sz.width = 0;
    local_48.sz.height = 0;
    local_48.flags = 0x1010000;
    local_48.obj = disp;
    cv::imshow((string *)local_68,&local_48);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    iVar1 = cv::waitKey(0x1e);
  } while (iVar1 != 0x1b);
  return;
}

Assistant:

void display_img(cv::Mat disp) {
    do {
        cv::imshow("Current image", disp);
        if (cv::waitKey(30) == 27) {
            return;
        }
    } while (true);
}